

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hak.cpp
# Opt level: O1

void __thiscall libDAI::HAK::HAK(HAK *this,FactorGraph *fg,Properties *opts)

{
  value vVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _Rb_tree_node_base *p_Var5;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  ostream *poVar6;
  Exception *pEVar7;
  Var *pVVar8;
  pointer pVVar9;
  _Self __tmp;
  ulong uVar10;
  VarSet i0d;
  RegionGraph rg;
  vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> local_258;
  vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> local_238;
  VarSet local_218;
  VarSet local_1f8;
  undefined1 local_1d8 [8];
  undefined1 auStack_1d0 [8];
  VarSet local_1c8 [12];
  
  DAIAlg<libDAI::RegionGraph>::DAIAlg(&this->super_DAIAlgRG,opts);
  (this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm =
       (_func_int **)&PTR_clone_005e7ec0;
  *(undefined8 *)&this->Props = 0;
  (this->Props).tol = 0.0;
  (this->Props).maxiter = 0;
  (this->Props).verbose = 0;
  (this->Props).damping = 0.0;
  *(undefined8 *)&(this->Props).doubleloop = 0;
  (this->Props).loopdepth = 0;
  this->_maxdiff = 0.0;
  this->_iterations = 0;
  (this->_Qa).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_Qa).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_Qa).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_Qb).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_Qb).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_Qb).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_muab).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_Qb).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_Qb).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_muab).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_muab).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_muab).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_muba).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_muba).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_muba).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = initProps(this);
  if (!bVar3) {
    pEVar7 = (Exception *)__cxa_allocate_exception(0x10);
    local_1d8 = (undefined1  [8])local_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"hak.cpp, line 118","");
    Exception::Exception(pEVar7,8,(string *)local_1d8);
    __cxa_throw(pEVar7,&Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  local_258.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vVar1 = (this->Props).clusters.v;
  if (vVar1 == MIN) {
    FactorGraph::Cliques(&local_238,fg);
    local_1c8[0]._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)local_258.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    auStack_1d0 = (undefined1  [8])
                  local_258.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
    local_1d8 = (undefined1  [8])
                local_258.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>.
                _M_impl.super__Vector_impl_data._M_start;
    local_258.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_238.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_258.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_238.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_258.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_238.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_238.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_238.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_238.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::~vector
              ((vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)local_1d8);
    std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::~vector(&local_238);
  }
  else if (vVar1 == LOOP) {
    FactorGraph::Cliques(&local_238,fg);
    local_1c8[0]._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)local_258.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    auStack_1d0 = (undefined1  [8])
                  local_258.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
    local_1d8 = (undefined1  [8])
                local_258.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>.
                _M_impl.super__Vector_impl_data._M_start;
    local_258.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_238.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_258.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_238.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_258.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_238.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_238.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_238.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_238.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::~vector
              ((vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)local_1d8);
    std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::~vector(&local_238);
    local_1c8[0]._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)auStack_1d0;
    auStack_1d0 = (undefined1  [8])((ulong)auStack_1d0 & 0xffffffff00000000);
    local_1c8[0]._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8[0]._statespace = 0;
    local_1c8[0]._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_1c8[0]._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
         super__Vector_impl_data._M_finish;
    iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[7])(fg);
    pVVar8 = *(Var **)CONCAT44(extraout_var_01,iVar4);
    while( true ) {
      iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[7])(fg);
      if (pVVar8 == *(Var **)(CONCAT44(extraout_var_02,iVar4) + 8)) break;
      (*(fg->super_GraphicalModel)._vptr_GraphicalModel[0xe])(&local_238,fg,pVVar8);
      if (1 < (this->Props).loopdepth) {
        VarSet::VarSet(&local_1f8,pVVar8);
        sVar2 = (this->Props).loopdepth;
        (*(fg->super_GraphicalModel)._vptr_GraphicalModel[0xe])(&local_218,fg,pVVar8);
        findLoopClusters(this,fg,(set<libDAI::VarSet,_std::less<libDAI::VarSet>,_std::allocator<libDAI::VarSet>_>
                                  *)local_1d8,&local_1f8,pVVar8,sVar2 - 1,&local_218);
        if (local_218._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_218._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_218._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_218._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1f8._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      if (local_238.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_238.
                        super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_238.
                              super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_238.
                              super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pVVar8 = pVVar8 + 1;
    }
    if ((_Rb_tree_node_base *)
        local_1c8[0]._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Rb_tree_node_base *)auStack_1d0) {
      p_Var5 = (_Rb_tree_node_base *)
               local_1c8[0]._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      do {
        std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::push_back
                  (&local_258,(value_type *)(p_Var5 + 1));
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      } while (p_Var5 != (_Rb_tree_node_base *)auStack_1d0);
    }
    iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
    if (2 < CONCAT44(extraout_var_03,iVar4)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"HAK uses the following clusters: ",0x21);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
      std::ostream::put(-0x50);
      std::ostream::flush();
      for (pVVar9 = local_258.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pVVar9 != local_258.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>.
                    _M_impl.super__Vector_impl_data._M_finish; pVVar9 = pVVar9 + 1) {
        for (pVVar8 = (pVVar9->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pVVar8 != (pVVar9->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                      _M_impl.super__Vector_impl_data._M_finish; pVVar8 = pVVar8 + 1) {
          libDAI::operator<<((ostream *)&std::cout,pVVar8);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
        std::ostream::put(-0x50);
        std::ostream::flush();
      }
    }
    std::
    _Rb_tree<libDAI::VarSet,_libDAI::VarSet,_std::_Identity<libDAI::VarSet>,_std::less<libDAI::VarSet>,_std::allocator<libDAI::VarSet>_>
    ::~_Rb_tree((_Rb_tree<libDAI::VarSet,_libDAI::VarSet,_std::_Identity<libDAI::VarSet>,_std::less<libDAI::VarSet>,_std::allocator<libDAI::VarSet>_>
                 *)local_1d8);
  }
  else {
    if (vVar1 != DELTA) {
      pEVar7 = (Exception *)__cxa_allocate_exception(0x10);
      local_1d8 = (undefined1  [8])local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"hak.cpp, line 142","");
      Exception::Exception(pEVar7,2,(string *)local_1d8);
      __cxa_throw(pEVar7,&Exception::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar10 = 0;
    while( true ) {
      iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[5])(fg);
      if (CONCAT44(extraout_var,iVar4) <= uVar10) break;
      iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[6])(fg,uVar10);
      (*(fg->super_GraphicalModel)._vptr_GraphicalModel[0xd])
                ((VarSet *)local_1d8,fg,CONCAT44(extraout_var_00,iVar4));
      std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::emplace_back<libDAI::VarSet>
                (&local_258,(VarSet *)local_1d8);
      if (local_1d8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1d8,
                        (long)local_1c8[0]._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start - (long)local_1d8);
      }
      uVar10 = uVar10 + 1;
    }
  }
  RegionGraph::RegionGraph((RegionGraph *)local_1d8,fg,&local_258);
  iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  RegionGraph::operator=((RegionGraph *)CONCAT44(extraout_var_04,iVar4),(RegionGraph *)local_1d8);
  constructMessages(this);
  iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
  if (2 < CONCAT44(extraout_var_05,iVar4)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"HAK regiongraph: ",0x11);
    iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    poVar6 = libDAI::operator<<((ostream *)&std::cout,(RegionGraph *)CONCAT44(extraout_var_06,iVar4)
                               );
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  RegionGraph::~RegionGraph((RegionGraph *)local_1d8);
  std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::~vector(&local_258);
  return;
}

Assistant:

HAK::HAK(const FactorGraph & fg, const Properties &opts) : DAIAlgRG(opts), Props(), _maxdiff(0.0), _iterations(0UL), _Qa(), _Qb(), _muab(), _muba() {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);

        vector<VarSet> cl;
        if( Props.clusters == ClustersType::MIN ) {
            cl = fg.Cliques();
        } else if( Props.clusters == ClustersType::DELTA ) {
            for( size_t i = 0; i < fg.nrVars(); i++ )
                cl.push_back(fg.Delta(fg.var(i))); 
        } else if( Props.clusters == ClustersType::LOOP ) {
            cl = fg.Cliques();
            set<VarSet> scl;
            for( vector<Var>::const_iterator i0 = fg.vars().begin(); i0 != fg.vars().end(); i0++ ) {
                VarSet i0d = fg.delta(*i0);
                if( Props.loopdepth > 1 )
                    findLoopClusters( fg, scl, *i0, *i0, Props.loopdepth - 1, fg.delta(*i0) );
            }
            for( set<VarSet>::const_iterator c = scl.begin(); c != scl.end(); c++ )
                cl.push_back(*c);
            if( Verbose() >= 3 ) {
                cout << "HAK uses the following clusters: " << endl;
                for( vector<VarSet>::const_iterator cli = cl.begin(); cli != cl.end(); cli++ )
                    cout << *cli << endl;
            }
        } else
            DAI_THROW(UNKNOWN_PROPERTY_TYPE);

        RegionGraph rg(fg,cl);
        grm() = rg;
        constructMessages();

    /*  if( (Props.clusters == ClustersType::LOOP) ) {
             double c_sum = 0.0;
             for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ )
                 c_sum += grm().OR(alpha).c();
             for( size_t beta = 0; beta < grm().nr_IRs(); beta++ )
                 c_sum += grm().IR(beta).c();
             cout << "Sum of cluster numbers: " << c_sum << endl;
        }*/

        if( Verbose() >= 3 )
            cout << "HAK regiongraph: " << grm() << endl;
    }